

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextobject.cpp
# Opt level: O0

void __thiscall QTextFramePrivate::fragmentAdded(QTextFramePrivate *this,QChar type,uint fragment)

{
  bool bVar1;
  undefined4 in_EDX;
  QChar *in_RDI;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffffe0;
  QChar local_10;
  QChar local_e;
  QChar local_c [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QChar::QChar<char16_t,_true>(local_c,L'﷐');
  bVar1 = ::operator==((QChar *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),in_RDI);
  if (bVar1) {
    *(undefined4 *)(in_RDI + 0x42) = in_EDX;
  }
  else {
    QChar::QChar<char16_t,_true>(&local_e,L'﷑');
    bVar1 = ::operator==((QChar *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),in_RDI);
    if (bVar1) {
      *(undefined4 *)(in_RDI + 0x44) = in_EDX;
    }
    else {
      QChar::QChar<QChar::SpecialCharacter,_true>(&local_10,ObjectReplacementCharacter);
      bVar1 = ::operator==((QChar *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),in_RDI);
      if (bVar1) {
        *(undefined4 *)(in_RDI + 0x42) = in_EDX;
        *(undefined4 *)(in_RDI + 0x44) = in_EDX;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextFramePrivate::fragmentAdded(QChar type, uint fragment)
{
    if (type == QTextBeginningOfFrame) {
        Q_ASSERT(!fragment_start);
        fragment_start = fragment;
    } else if (type == QTextEndOfFrame) {
        Q_ASSERT(!fragment_end);
        fragment_end = fragment;
    } else if (type == QChar::ObjectReplacementCharacter) {
        Q_ASSERT(!fragment_start);
        Q_ASSERT(!fragment_end);
        fragment_start = fragment;
        fragment_end = fragment;
    } else {
        Q_ASSERT(false);
    }
}